

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

void __thiscall re2::Tester::~Tester(Tester *this)

{
  TestInstance *this_00;
  pointer ppTVar1;
  ulong uVar2;
  
  ppTVar1 = (this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->v_).super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppTVar1) {
    uVar2 = 0;
    do {
      this_00 = ppTVar1[uVar2];
      if (this_00 != (TestInstance *)0x0) {
        TestInstance::~TestInstance(this_00);
        operator_delete(this_00);
      }
      uVar2 = uVar2 + 1;
      ppTVar1 = (this->v_).
                super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->v_).
                                   super__Vector_base<re2::TestInstance_*,_std::allocator<re2::TestInstance_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3))
    ;
  }
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1);
    return;
  }
  return;
}

Assistant:

Tester::~Tester() {
  for (size_t i = 0; i < v_.size(); i++)
    delete v_[i];
}